

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_16U,_8U>::Bucket::Insert
          (Bucket *this,Data<8U> *item,uint32_t seed_s,uint32_t seed_incast,bool *is_empty)

{
  int iVar1;
  int iVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  uVar4 = Data<8U>::Hash(item,seed_s);
  uVar5 = Data<8U>::Hash(item,seed_incast);
  uVar6 = uVar5 & 0xf;
  *is_empty = false;
  uVar7 = 0xffffffff;
  iVar9 = 0x7fffffff;
  lVar10 = 0;
  uVar8 = 0;
  while( true ) {
    iVar1 = this->counters[uVar8];
    if (iVar1 == 0) {
      *(undefined8 *)this->items[uVar8].str = *(undefined8 *)item->str;
      this->counters[uVar8] = -1;
      *is_empty = true;
      return;
    }
    if (*(long *)(this->items[0].str + lVar10) == *(long *)item->str) break;
    iVar11 = -iVar1;
    if (0 < iVar1) {
      iVar11 = iVar1;
    }
    if (iVar11 < iVar9) {
      uVar7 = uVar8 & 0xffffffff;
      iVar9 = iVar11;
    }
    uVar8 = uVar8 + 1;
    lVar10 = lVar10 + 8;
    if (uVar8 == 8) {
      sVar3 = this->incast[uVar6];
      iVar1 = COUNT[uVar4 & 1];
      if (iVar9 <= sVar3 * iVar1) {
        if (this->counters[uVar7] < 0) {
          uVar4 = Data<8U>::Hash(this->items + uVar7,seed_s);
          iVar11 = this->counters[uVar7];
          iVar2 = COUNT[uVar4 & 1];
          uVar4 = Data<8U>::Hash(this->items + uVar7,seed_incast);
          this->incast[uVar4 & 0xf] = this->incast[uVar4 & 0xf] - (short)iVar11 * (short)iVar2;
        }
        *(undefined8 *)this->items[uVar7].str = *(undefined8 *)item->str;
        this->counters[uVar7] = iVar9 + 1;
        sVar3 = this->incast[uVar6];
      }
      this->incast[uVar6] = sVar3 + (short)iVar1;
      return;
    }
  }
  if (-1 < iVar1) {
    this->counters[uVar8] = iVar1 + 1;
    this->incast[uVar6] = this->incast[uVar6] + (short)COUNT[uVar4 & 1];
    return;
  }
  this->counters[uVar8] = iVar1 + -1;
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool& is_empty) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type min_num = INT_MAX;
			uint32_t min_pos = -1;
			is_empty = false;
			for (uint32_t i = 0; i < slot_num; ++i) {
				if (counters[i] == 0) {
					// The error free item's counter is negative, which is a trick to
					// be differentiated from items which are not error free.
					items[i] = item;
					counters[i] = -1;
					is_empty = true;
					return;
				}
				else if (items[i] == item) {
					if (counters[i] < 0)
						counters[i]--;
					else {
						counters[i]++;
						incast[whichcast] += COUNT[choice];
					}
					return;
				}

				count_type counter_val = std::abs(counters[i]);
				if (counter_val < min_num) {
					min_num = counter_val;
					min_pos = i;
				}
			}

			if (incast[whichcast] * COUNT[choice] >= int(min_num * factor)) {
				if (counters[min_pos] < 0) {
					uint32_t min_choice = items[min_pos].Hash(seed_s) & 1;
					incast[items[min_pos].Hash(seed_incast) % counter_num] -=
						COUNT[min_choice] * counters[min_pos];
				}
				items[min_pos] = item;
				counters[min_pos] = min_num + 1;
			}
			incast[whichcast] += COUNT[choice];
		}